

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O0

string * XmlRpc::XmlRpcUtil::parseTag(char *tag,string *xml,int *offset)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int *in_RCX;
  string *in_RDX;
  char *in_RSI;
  string *in_RDI;
  size_t iend;
  string etag;
  size_t istart;
  int local_68;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_48 [32];
  long local_28;
  int *local_20;
  string *local_18;
  char *local_10;
  
  iVar2 = *in_RCX;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = std::__cxx11::string::length();
  if (iVar2 < iVar1) {
    local_28 = std::__cxx11::string::find((char *)local_18,(ulong)local_10);
    if (local_28 == -1) {
      std::__cxx11::string::string((string *)in_RDI);
    }
    else {
      sVar3 = strlen(local_10);
      local_28 = local_28 + sVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
      std::__cxx11::string::operator+=(local_48,local_10 + 1);
      lVar4 = std::__cxx11::string::find(local_18,(ulong)local_48);
      if (lVar4 == -1) {
        std::__cxx11::string::string((string *)in_RDI);
      }
      else {
        local_68 = (int)lVar4;
        iVar2 = std::__cxx11::string::length();
        *local_20 = local_68 + iVar2;
        std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_18);
      }
      std::__cxx11::string::~string(local_48);
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string 
XmlRpcUtil::parseTag(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return std::string();
  size_t istart = xml.find(tag, *offset);
  if (istart == std::string::npos) return std::string();
  istart += strlen(tag);
  std::string etag = "</";
  etag += tag + 1;
  size_t iend = xml.find(etag, istart);
  if (iend == std::string::npos) return std::string();

  *offset = int(iend + etag.length());
  return xml.substr(istart, iend-istart);
}